

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::seek(BreakCache *this,int32_t pos)

{
  int32_t *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = this->fStartBufIdx;
  uVar2 = (ulong)(int)uVar5;
  if (this->fBoundaries[uVar2] <= pos) {
    uVar3 = this->fEndBufIdx;
    uVar4 = (ulong)(int)uVar3;
    if (pos <= this->fBoundaries[uVar4]) {
      if (this->fBoundaries[uVar2] == pos) {
        piVar1 = this->fBoundaries + uVar2;
        this->fBufIdx = uVar5;
      }
      else if (this->fBoundaries[uVar4] == pos) {
        piVar1 = this->fBoundaries + uVar4;
        this->fBufIdx = uVar3;
      }
      else {
        if (uVar5 != uVar3) {
          do {
            uVar3 = (uint)uVar4;
            uVar6 = (int)((uint)((int)uVar3 < (int)uVar2) * 0x80 + uVar3 + (int)uVar2) / 2;
            uVar5 = uVar6 & 0x7f;
            uVar4 = (ulong)(uVar6 + 1 & 0x7f);
            if (pos < this->fBoundaries[uVar5]) {
              uVar3 = uVar5;
              uVar4 = uVar2 & 0xffffffff;
            }
            uVar2 = uVar4;
            uVar4 = (ulong)uVar3;
          } while ((uint)uVar2 != uVar3);
        }
        uVar5 = uVar3 - 1 & 0x7f;
        this->fBufIdx = uVar5;
        piVar1 = this->fBoundaries + uVar5;
      }
      this->fTextIdx = *piVar1;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::seek(int32_t pos) {
    if (pos < fBoundaries[fStartBufIdx] || pos > fBoundaries[fEndBufIdx]) {
        return FALSE;
    }
    if (pos == fBoundaries[fStartBufIdx]) {
        // Common case: seek(0), from BreakIterator::first()
        fBufIdx = fStartBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }
    if (pos == fBoundaries[fEndBufIdx]) {
        fBufIdx = fEndBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }

    int32_t min = fStartBufIdx;
    int32_t max = fEndBufIdx;
    while (min != max) {
        int32_t probe = (min + max + (min>max ? CACHE_SIZE : 0)) / 2;
        probe = modChunkSize(probe);
        if (fBoundaries[probe] > pos) {
            max = probe;
        } else {
            min = modChunkSize(probe + 1);
        }
    }
    U_ASSERT(fBoundaries[max] > pos);
    fBufIdx = modChunkSize(max - 1);
    fTextIdx = fBoundaries[fBufIdx];
    U_ASSERT(fTextIdx <= pos);
    return TRUE;
}